

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O2

void hw_breakpoint_remove(CPUX86State *env,int index)

{
  CPUX86State *__mptr;
  
  switch((uint)(env->dr[7] >> ((char)index * '\x04' + 0x10U & 0x3f)) & 3) {
  case 0:
    if ((CPUBreakpoint *)env->dr[(long)index + 8] == (CPUBreakpoint *)0x0) {
      return;
    }
    cpu_breakpoint_remove_by_ref_x86_64
              ((CPUState *)(env[-6].mtrr_var + 4),(CPUBreakpoint *)env->dr[(long)index + 8]);
    break;
  default:
    if ((CPUWatchpoint *)env->dr[(long)index + 8] == (CPUWatchpoint *)0x0) {
      return;
    }
    cpu_watchpoint_remove_by_ref_x86_64
              ((CPUState *)(env[-6].mtrr_var + 4),(CPUWatchpoint *)env->dr[(long)index + 8]);
    break;
  case 2:
    goto switchD_004c53ed_caseD_2;
  }
  env->dr[(long)index + 8] = 0;
switchD_004c53ed_caseD_2:
  return;
}

Assistant:

static void hw_breakpoint_remove(CPUX86State *env, int index)
{
    CPUState *cs = env_cpu(env);

    switch (hw_breakpoint_type(env->dr[7], index)) {
    case DR7_TYPE_BP_INST:
        if (env->cpu_breakpoint[index]) {
            cpu_breakpoint_remove_by_ref(cs, env->cpu_breakpoint[index]);
            env->cpu_breakpoint[index] = NULL;
        }
        break;

    case DR7_TYPE_DATA_WR:
    case DR7_TYPE_DATA_RW:
        if (env->cpu_breakpoint[index]) {
            cpu_watchpoint_remove_by_ref(cs, env->cpu_watchpoint[index]);
            env->cpu_breakpoint[index] = NULL;
        }
        break;

    case DR7_TYPE_IO_RW:
        /* HF_IOBPT_MASK cleared elsewhere.  */
        break;
    }
}